

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bstrListDestroy(bstrList *sl)

{
  int iVar1;
  long lVar2;
  
  iVar1 = -1;
  if ((sl != (bstrList *)0x0) && (iVar1 = -1, -1 < sl->qty)) {
    if (0 < sl->qty) {
      lVar2 = 0;
      do {
        if (sl->entry[lVar2] != (bstring)0x0) {
          bdestroy(sl->entry[lVar2]);
          sl->entry[lVar2] = (bstring)0x0;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < sl->qty);
    }
    sl->qty = -1;
    sl->mlen = -1;
    free(sl->entry);
    sl->entry = (bstring *)0x0;
    free(sl);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int bstrListDestroy (struct bstrList * sl) {
int i;
	if (sl == NULL || sl->qty < 0) return BSTR_ERR;
	for (i=0; i < sl->qty; i++) {
		if (sl->entry[i]) {
			bdestroy (sl->entry[i]);
			sl->entry[i] = NULL;
		}
	}
	sl->qty  = -1;
	sl->mlen = -1;
	bstr__free (sl->entry);
	sl->entry = NULL;
	bstr__free (sl);
	return BSTR_OK;
}